

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-arithm.cpp
# Opt level: O2

void test_arithm<double>(uint length,double value1,double value2,bool allowTrash)

{
  _func_int ***ppp_Var1;
  double *pdVar2;
  double *pdVar3;
  undefined1 (*pauVar4) [16];
  double dVar5;
  double dVar6;
  double dVar7;
  double *pdVar8;
  undefined8 *puVar9;
  ulong uVar10;
  undefined1 (*pauVar11) [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var12;
  ulong uVar13;
  long lVar14;
  double *pdVar15;
  undefined1 (*pauVar16) [16];
  uint uVar17;
  double *pdVar18;
  ulong uVar19;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> _Var20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> _Var21;
  double dVar22;
  double dVar23;
  double dVar24;
  undefined1 auVar25 [16];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> _Var26;
  double dVar27;
  undefined1 auVar28 [16];
  double dVar29;
  undefined1 (*local_50) [16];
  shared_ptr<double> pv1;
  shared_ptr<double> pv2;
  shared_ptr<double> presult;
  
  pdVar8 = sse::common::malloc<double>(length);
  std::__shared_ptr<double,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<double,void(*)(double*),void>
            ((__shared_ptr<double,(__gnu_cxx::_Lock_policy)2> *)&local_50,pdVar8,
             sse::common::free<double>);
  pdVar8 = sse::common::malloc<double>(length);
  std::__shared_ptr<double,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<double,void(*)(double*),void>
            ((__shared_ptr<double,(__gnu_cxx::_Lock_policy)2> *)
             &pv1.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount,pdVar8,
             sse::common::free<double>);
  pdVar8 = sse::common::malloc<double>(length + 1);
  std::__shared_ptr<double,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<double,void(*)(double*),void>
            ((__shared_ptr<double,(__gnu_cxx::_Lock_policy)2> *)
             &pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount,pdVar8,
             sse::common::free<double>);
  uVar10 = (ulong)length;
  (&(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
    _vptr__Sp_counted_base)[uVar10] = (_func_int **)0x405fc00000000000;
  pauVar16 = local_50;
  for (uVar17 = length; 7 < (int)uVar17; uVar17 = uVar17 - 8) {
    *(double *)*pauVar16 = value1;
    *(double *)(*pauVar16 + 8) = value1;
    *(double *)pauVar16[1] = value1;
    *(double *)(pauVar16[1] + 8) = value1;
    *(double *)pauVar16[2] = value1;
    *(double *)(pauVar16[2] + 8) = value1;
    *(double *)pauVar16[3] = value1;
    *(double *)(pauVar16[3] + 8) = value1;
    pauVar16 = pauVar16 + 4;
  }
  if (3 < (int)uVar17) {
    *(double *)*pauVar16 = value1;
    *(double *)(*pauVar16 + 8) = value1;
    *(double *)pauVar16[1] = value1;
    *(double *)(pauVar16[1] + 8) = value1;
    uVar17 = uVar17 - 4;
    pauVar16 = pauVar16 + 2;
  }
  if (1 < (int)uVar17) {
    *(double *)*pauVar16 = value1;
    *(double *)(*pauVar16 + 8) = value1;
    uVar17 = uVar17 - 2;
    pauVar16 = pauVar16 + 1;
  }
  if (uVar17 != 0) {
    *(double *)*pauVar16 = value1;
  }
  _Var20._8_8_ = value2;
  _Var20._vptr__Sp_counted_base = (_func_int **)value2;
  _Var12 = pv1.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  for (uVar17 = length; 7 < (int)uVar17; uVar17 = uVar17 - 8) {
    *_Var12._M_pi = _Var20;
    _Var12._M_pi[1] = _Var20;
    _Var12._M_pi[2] = _Var20;
    _Var12._M_pi[3] = _Var20;
    _Var12._M_pi = _Var12._M_pi + 4;
  }
  if (3 < (int)uVar17) {
    *_Var12._M_pi = _Var20;
    _Var12._M_pi[1] = _Var20;
    uVar17 = uVar17 - 4;
    _Var12._M_pi = _Var12._M_pi + 2;
  }
  if (1 < (int)uVar17) {
    *_Var12._M_pi = _Var20;
    uVar17 = uVar17 - 2;
    _Var12._M_pi = _Var12._M_pi + 1;
  }
  if (uVar17 != 0) {
    (_Var12._M_pi)->_vptr__Sp_counted_base = (_func_int **)value2;
  }
  uVar13 = 0;
  while (uVar10 != uVar13) {
    dVar22 = *(double *)(*local_50 + uVar13 * 8) - value1;
    uVar19 = -(ulong)(dVar22 < 0.0);
    if ((2.220446049250313e-16 <=
         (double)(~uVar19 & (ulong)dVar22 |
                 (ulong)(value1 - *(double *)(*local_50 + uVar13 * 8)) & uVar19)) ||
       (ppp_Var1 = &(pv1.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                    _vptr__Sp_counted_base + uVar13, dVar22 = (double)*ppp_Var1 - value2,
       uVar19 = -(ulong)(dVar22 < 0.0), uVar13 = uVar13 + 1,
       2.220446049250313e-16 <=
       (double)(~uVar19 & (ulong)dVar22 | (ulong)(value2 - (double)*ppp_Var1) & uVar19))) {
      puVar9 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar9 = "void test_arithm(unsigned int, T, T, bool) [T = double]";
      *(undefined4 *)(puVar9 + 1) = 0x1a;
      *(uint *)((long)puVar9 + 0xc) = length;
      __cxa_throw(puVar9,&Exception::typeinfo,0);
    }
  }
  lVar14 = 0;
  for (uVar17 = length; 3 < (int)uVar17; uVar17 = uVar17 - 4) {
    dVar27 = *(double *)((long)(*local_50 + lVar14) + 8);
    dVar29 = *(double *)(local_50[1] + lVar14);
    dVar5 = *(double *)((long)(local_50[1] + lVar14) + 8);
    pdVar8 = (double *)
             ((long)&(pv1.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                     ->_vptr__Sp_counted_base + lVar14);
    dVar23 = pdVar8[1];
    pdVar18 = (double *)
              ((long)&pv1.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                      [1]._vptr__Sp_counted_base + lVar14);
    dVar22 = *pdVar18;
    dVar24 = pdVar18[1];
    pdVar18 = (double *)
              ((long)&(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                      ->_vptr__Sp_counted_base + lVar14);
    *pdVar18 = *(double *)(*local_50 + lVar14) + *pdVar8;
    pdVar18[1] = dVar27 + dVar23;
    pdVar8 = (double *)
             ((long)&pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1]
                     ._vptr__Sp_counted_base + lVar14);
    *pdVar8 = dVar29 + dVar22;
    pdVar8[1] = dVar5 + dVar24;
    lVar14 = lVar14 + 0x20;
  }
  if ((int)uVar17 < 2) {
    pdVar8 = (double *)
             ((long)&(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                     ->_vptr__Sp_counted_base + lVar14);
    pdVar18 = (double *)
              ((long)&(pv1.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                      ->_vptr__Sp_counted_base + lVar14);
    pdVar15 = (double *)(*local_50 + lVar14);
  }
  else {
    pdVar2 = (double *)
             ((long)&(pv1.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                     ->_vptr__Sp_counted_base + lVar14);
    pdVar18 = pdVar2 + 2;
    pdVar15 = (double *)(local_50[1] + lVar14);
    dVar23 = pdVar15[-1];
    dVar22 = pdVar2[1];
    pdVar3 = (double *)
             ((long)&(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                     ->_vptr__Sp_counted_base + lVar14);
    pdVar8 = pdVar3 + 2;
    *pdVar3 = pdVar15[-2] + *pdVar2;
    pdVar3[1] = dVar23 + dVar22;
    uVar17 = uVar17 - 2;
  }
  if (uVar17 != 0) {
    *pdVar8 = *pdVar15 + *pdVar18;
  }
  dVar22 = value1 + value2;
  uVar13 = 0;
  while (uVar10 != uVar13) {
    ppp_Var1 = &(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                _vptr__Sp_counted_base + uVar13;
    dVar23 = (double)*ppp_Var1 - dVar22;
    uVar19 = -(ulong)(dVar23 < 0.0);
    uVar13 = uVar13 + 1;
    if (2.220446049250313e-16 <=
        (double)(~uVar19 & (ulong)dVar23 | (ulong)(dVar22 - (double)*ppp_Var1) & uVar19)) {
      puVar9 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar9 = "void test_arithm(unsigned int, T, T, bool) [T = double]";
      *(undefined4 *)(puVar9 + 1) = 0x22;
      *(uint *)((long)puVar9 + 0xc) = length;
      __cxa_throw(puVar9,&Exception::typeinfo,0);
    }
  }
  lVar14 = 0;
  for (uVar17 = length; 3 < (int)uVar17; uVar17 = uVar17 - 4) {
    dVar23 = *(double *)((long)(*local_50 + lVar14) + 8);
    dVar24 = *(double *)(local_50[1] + lVar14);
    dVar27 = *(double *)((long)(local_50[1] + lVar14) + 8);
    pdVar8 = (double *)
             ((long)&(pv1.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                     ->_vptr__Sp_counted_base + lVar14);
    dVar29 = pdVar8[1];
    pdVar18 = (double *)
              ((long)&pv1.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                      [1]._vptr__Sp_counted_base + lVar14);
    dVar5 = *pdVar18;
    dVar6 = pdVar18[1];
    pdVar18 = (double *)
              ((long)&(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                      ->_vptr__Sp_counted_base + lVar14);
    *pdVar18 = *(double *)(*local_50 + lVar14) - *pdVar8;
    pdVar18[1] = dVar23 - dVar29;
    pdVar8 = (double *)
             ((long)&pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1]
                     ._vptr__Sp_counted_base + lVar14);
    *pdVar8 = dVar24 - dVar5;
    pdVar8[1] = dVar27 - dVar6;
    lVar14 = lVar14 + 0x20;
  }
  if ((int)uVar17 < 2) {
    pdVar8 = (double *)
             ((long)&(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                     ->_vptr__Sp_counted_base + lVar14);
    pdVar18 = (double *)
              ((long)&(pv1.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                      ->_vptr__Sp_counted_base + lVar14);
    pdVar15 = (double *)(*local_50 + lVar14);
  }
  else {
    pdVar2 = (double *)
             ((long)&(pv1.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                     ->_vptr__Sp_counted_base + lVar14);
    pdVar18 = pdVar2 + 2;
    pdVar15 = (double *)(local_50[1] + lVar14);
    dVar23 = pdVar15[-1];
    dVar24 = pdVar2[1];
    pdVar3 = (double *)
             ((long)&(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                     ->_vptr__Sp_counted_base + lVar14);
    pdVar8 = pdVar3 + 2;
    *pdVar3 = pdVar15[-2] - *pdVar2;
    pdVar3[1] = dVar23 - dVar24;
    uVar17 = uVar17 - 2;
  }
  if (uVar17 != 0) {
    *pdVar8 = *pdVar15 - *pdVar18;
  }
  dVar23 = value1 - value2;
  uVar13 = 0;
  while (uVar10 != uVar13) {
    ppp_Var1 = &(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                _vptr__Sp_counted_base + uVar13;
    dVar24 = (double)*ppp_Var1 - dVar23;
    uVar19 = -(ulong)(dVar24 < 0.0);
    uVar13 = uVar13 + 1;
    if (2.220446049250313e-16 <=
        (double)(~uVar19 & (ulong)dVar24 | (ulong)(dVar23 - (double)*ppp_Var1) & uVar19)) {
      puVar9 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar9 = "void test_arithm(unsigned int, T, T, bool) [T = double]";
      *(undefined4 *)(puVar9 + 1) = 0x2a;
      *(uint *)((long)puVar9 + 0xc) = length;
      __cxa_throw(puVar9,&Exception::typeinfo,0);
    }
  }
  lVar14 = 0;
  for (uVar17 = length; 3 < (int)uVar17; uVar17 = uVar17 - 4) {
    dVar24 = *(double *)((long)(*local_50 + lVar14) + 8);
    dVar27 = *(double *)(local_50[1] + lVar14);
    dVar29 = *(double *)((long)(local_50[1] + lVar14) + 8);
    pdVar8 = (double *)
             ((long)&(pv1.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                     ->_vptr__Sp_counted_base + lVar14);
    dVar5 = pdVar8[1];
    pdVar18 = (double *)
              ((long)&pv1.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                      [1]._vptr__Sp_counted_base + lVar14);
    dVar6 = *pdVar18;
    dVar7 = pdVar18[1];
    pdVar18 = (double *)
              ((long)&(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                      ->_vptr__Sp_counted_base + lVar14);
    *pdVar18 = *(double *)(*local_50 + lVar14) * *pdVar8;
    pdVar18[1] = dVar24 * dVar5;
    pdVar8 = (double *)
             ((long)&pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1]
                     ._vptr__Sp_counted_base + lVar14);
    *pdVar8 = dVar27 * dVar6;
    pdVar8[1] = dVar29 * dVar7;
    lVar14 = lVar14 + 0x20;
  }
  if ((int)uVar17 < 2) {
    pdVar8 = (double *)
             ((long)&(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                     ->_vptr__Sp_counted_base + lVar14);
    pdVar18 = (double *)
              ((long)&(pv1.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                      ->_vptr__Sp_counted_base + lVar14);
    pdVar15 = (double *)(*local_50 + lVar14);
  }
  else {
    pdVar2 = (double *)
             ((long)&(pv1.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                     ->_vptr__Sp_counted_base + lVar14);
    pdVar18 = pdVar2 + 2;
    pdVar15 = (double *)(local_50[1] + lVar14);
    dVar24 = pdVar15[-1];
    dVar27 = pdVar2[1];
    pdVar3 = (double *)
             ((long)&(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                     ->_vptr__Sp_counted_base + lVar14);
    pdVar8 = pdVar3 + 2;
    *pdVar3 = pdVar15[-2] * *pdVar2;
    pdVar3[1] = dVar24 * dVar27;
    uVar17 = uVar17 - 2;
  }
  if (uVar17 != 0) {
    *pdVar8 = *pdVar15 * *pdVar18;
  }
  dVar24 = value1 * value2;
  uVar13 = 0;
  while (uVar10 != uVar13) {
    ppp_Var1 = &(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                _vptr__Sp_counted_base + uVar13;
    dVar27 = (double)*ppp_Var1 - dVar24;
    uVar19 = -(ulong)(dVar27 < 0.0);
    uVar13 = uVar13 + 1;
    if (2.220446049250313e-16 <=
        (double)(~uVar19 & (ulong)dVar27 | (ulong)(dVar24 - (double)*ppp_Var1) & uVar19)) {
      puVar9 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar9 = "void test_arithm(unsigned int, T, T, bool) [T = double]";
      *(undefined4 *)(puVar9 + 1) = 0x32;
      *(uint *)((long)puVar9 + 0xc) = length;
      __cxa_throw(puVar9,&Exception::typeinfo,0);
    }
  }
  lVar14 = 0;
  for (uVar17 = length; 3 < (int)uVar17; uVar17 = uVar17 - 4) {
    auVar25 = divpd(*(undefined1 (*) [16])(*local_50 + lVar14),
                    *(undefined1 (*) [16])
                     ((long)&(pv1.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                             ._M_pi)->_vptr__Sp_counted_base + lVar14));
    auVar28 = divpd(*(undefined1 (*) [16])(local_50[1] + lVar14),
                    *(undefined1 (*) [16])
                     ((long)&pv1.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                             _M_pi[1]._vptr__Sp_counted_base + lVar14));
    *(undefined1 (*) [16])
     ((long)&(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
             _vptr__Sp_counted_base + lVar14) = auVar25;
    *(undefined1 (*) [16])
     ((long)&pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi[1].
             _vptr__Sp_counted_base + lVar14) = auVar28;
    lVar14 = lVar14 + 0x20;
  }
  if ((int)uVar17 < 2) {
    pauVar16 = (undefined1 (*) [16])
               ((long)&(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                       )->_vptr__Sp_counted_base + lVar14);
    pauVar11 = (undefined1 (*) [16])
               ((long)&(pv1.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                       )->_vptr__Sp_counted_base + lVar14);
    pdVar8 = (double *)(*local_50 + lVar14);
  }
  else {
    pauVar16 = (undefined1 (*) [16])
               ((long)&(pv1.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                       )->_vptr__Sp_counted_base + lVar14);
    pauVar11 = pauVar16 + 1;
    pdVar8 = (double *)(local_50[1] + lVar14);
    auVar25 = divpd(*(undefined1 (*) [16])(pdVar8 + -2),*pauVar16);
    pauVar4 = (undefined1 (*) [16])
              ((long)&(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                      ->_vptr__Sp_counted_base + lVar14);
    pauVar16 = pauVar4 + 1;
    *pauVar4 = auVar25;
    uVar17 = uVar17 - 2;
  }
  if (uVar17 != 0) {
    *(double *)*pauVar16 = *pdVar8 / *(double *)*pauVar11;
  }
  dVar27 = value1 / value2;
  uVar13 = 0;
  while (_Var12 = pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
        pauVar16 = local_50, uVar17 = length, uVar10 != uVar13) {
    ppp_Var1 = &(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                _vptr__Sp_counted_base + uVar13;
    dVar29 = (double)*ppp_Var1 - dVar27;
    uVar19 = -(ulong)(dVar29 < 0.0);
    uVar13 = uVar13 + 1;
    if (2.220446049250313e-16 <=
        (double)(~uVar19 & (ulong)dVar29 | (ulong)(dVar27 - (double)*ppp_Var1) & uVar19)) {
      puVar9 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar9 = "void test_arithm(unsigned int, T, T, bool) [T = double]";
      *(undefined4 *)(puVar9 + 1) = 0x3a;
      *(uint *)((long)puVar9 + 0xc) = length;
      __cxa_throw(puVar9,&Exception::typeinfo,0);
    }
  }
  for (; 3 < (int)uVar17; uVar17 = uVar17 - 4) {
    dVar29 = *(double *)(*pauVar16 + 8);
    dVar5 = *(double *)pauVar16[1];
    dVar6 = *(double *)(pauVar16[1] + 8);
    (_Var12._M_pi)->_vptr__Sp_counted_base = (_func_int **)(*(double *)*pauVar16 + value2);
    *(double *)&(_Var12._M_pi)->_M_use_count = dVar29 + value2;
    _Var12._M_pi[1]._vptr__Sp_counted_base = (_func_int **)(dVar5 + value2);
    *(double *)&_Var12._M_pi[1]._M_use_count = dVar6 + value2;
    _Var12._M_pi = _Var12._M_pi + 2;
    pauVar16 = pauVar16 + 2;
  }
  if (1 < (int)uVar17) {
    dVar29 = *(double *)(*pauVar16 + 8);
    (_Var12._M_pi)->_vptr__Sp_counted_base = (_func_int **)(*(double *)*pauVar16 + value2);
    *(double *)&(_Var12._M_pi)->_M_use_count = dVar29 + value2;
    uVar17 = uVar17 - 2;
    pauVar16 = pauVar16 + 1;
    _Var12._M_pi = _Var12._M_pi + 1;
  }
  if (uVar17 != 0) {
    (_Var12._M_pi)->_vptr__Sp_counted_base = (_func_int **)(*(double *)*pauVar16 + value2);
  }
  uVar13 = 0;
  while (_Var12 = pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
        pauVar16 = local_50, uVar17 = length, uVar10 != uVar13) {
    ppp_Var1 = &(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                _vptr__Sp_counted_base + uVar13;
    dVar29 = (double)*ppp_Var1 - dVar22;
    uVar19 = -(ulong)(dVar29 < 0.0);
    uVar13 = uVar13 + 1;
    if (2.220446049250313e-16 <=
        (double)(~uVar19 & (ulong)dVar29 | (ulong)(dVar22 - (double)*ppp_Var1) & uVar19)) {
      puVar9 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar9 = "void test_arithm(unsigned int, T, T, bool) [T = double]";
      *(undefined4 *)(puVar9 + 1) = 0x43;
      *(uint *)((long)puVar9 + 0xc) = length;
      __cxa_throw(puVar9,&Exception::typeinfo,0);
    }
  }
  for (; 3 < (int)uVar17; uVar17 = uVar17 - 4) {
    dVar22 = *(double *)(*pauVar16 + 8);
    dVar29 = *(double *)pauVar16[1];
    dVar5 = *(double *)(pauVar16[1] + 8);
    (_Var12._M_pi)->_vptr__Sp_counted_base = (_func_int **)(*(double *)*pauVar16 - value2);
    *(double *)&(_Var12._M_pi)->_M_use_count = dVar22 - value2;
    _Var12._M_pi[1]._vptr__Sp_counted_base = (_func_int **)(dVar29 - value2);
    *(double *)&_Var12._M_pi[1]._M_use_count = dVar5 - value2;
    _Var12._M_pi = _Var12._M_pi + 2;
    pauVar16 = pauVar16 + 2;
  }
  if (1 < (int)uVar17) {
    dVar22 = *(double *)(*pauVar16 + 8);
    (_Var12._M_pi)->_vptr__Sp_counted_base = (_func_int **)(*(double *)*pauVar16 - value2);
    *(double *)&(_Var12._M_pi)->_M_use_count = dVar22 - value2;
    uVar17 = uVar17 - 2;
    pauVar16 = pauVar16 + 1;
    _Var12._M_pi = _Var12._M_pi + 1;
  }
  if (uVar17 != 0) {
    (_Var12._M_pi)->_vptr__Sp_counted_base = (_func_int **)(*(double *)*pauVar16 - value2);
  }
  uVar13 = 0;
  while (_Var12 = pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
        pauVar16 = local_50, uVar17 = length, uVar10 != uVar13) {
    ppp_Var1 = &(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                _vptr__Sp_counted_base + uVar13;
    uVar13 = uVar13 + 1;
    if (((double)*ppp_Var1 != dVar23) || (NAN((double)*ppp_Var1) || NAN(dVar23))) {
      puVar9 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar9 = "void test_arithm(unsigned int, T, T, bool) [T = double]";
      *(undefined4 *)(puVar9 + 1) = 0x4b;
      *(uint *)((long)puVar9 + 0xc) = length;
      __cxa_throw(puVar9,&Exception::typeinfo,0);
    }
  }
  for (; 3 < (int)uVar17; uVar17 = uVar17 - 4) {
    dVar22 = *(double *)(*pauVar16 + 8);
    dVar23 = *(double *)pauVar16[1];
    dVar29 = *(double *)(pauVar16[1] + 8);
    (_Var12._M_pi)->_vptr__Sp_counted_base = (_func_int **)(value2 - *(double *)*pauVar16);
    *(double *)&(_Var12._M_pi)->_M_use_count = value2 - dVar22;
    _Var12._M_pi[1]._vptr__Sp_counted_base = (_func_int **)(value2 - dVar23);
    *(double *)&_Var12._M_pi[1]._M_use_count = value2 - dVar29;
    _Var12._M_pi = _Var12._M_pi + 2;
    pauVar16 = pauVar16 + 2;
  }
  if (1 < (int)uVar17) {
    dVar22 = *(double *)(*pauVar16 + 8);
    (_Var12._M_pi)->_vptr__Sp_counted_base = (_func_int **)(value2 - *(double *)*pauVar16);
    *(double *)&(_Var12._M_pi)->_M_use_count = value2 - dVar22;
    uVar17 = uVar17 - 2;
    pauVar16 = pauVar16 + 1;
    _Var12._M_pi = _Var12._M_pi + 1;
  }
  if (uVar17 != 0) {
    (_Var12._M_pi)->_vptr__Sp_counted_base = (_func_int **)(value2 - *(double *)*pauVar16);
  }
  uVar13 = 0;
  while (_Var12 = pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
        pauVar16 = local_50, uVar17 = length, uVar10 != uVar13) {
    ppp_Var1 = &(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                _vptr__Sp_counted_base + uVar13;
    dVar22 = (double)*ppp_Var1 - (value2 - value1);
    uVar19 = -(ulong)(dVar22 < 0.0);
    uVar13 = uVar13 + 1;
    if (2.220446049250313e-16 <=
        (double)(~uVar19 & (ulong)dVar22 | (ulong)((value2 - value1) - (double)*ppp_Var1) & uVar19))
    {
      puVar9 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar9 = "void test_arithm(unsigned int, T, T, bool) [T = double]";
      *(undefined4 *)(puVar9 + 1) = 0x53;
      *(uint *)((long)puVar9 + 0xc) = length;
      __cxa_throw(puVar9,&Exception::typeinfo,0);
    }
  }
  for (; 3 < (int)uVar17; uVar17 = uVar17 - 4) {
    _Var21._vptr__Sp_counted_base = (_func_int **)(*(double *)*pauVar16 * value2);
    _Var21._8_8_ = *(double *)(*pauVar16 + 8) * value2;
    dVar22 = *(double *)pauVar16[1];
    dVar23 = *(double *)(pauVar16[1] + 8);
    *_Var12._M_pi = _Var21;
    _Var12._M_pi[1]._vptr__Sp_counted_base = (_func_int **)(dVar22 * value2);
    *(double *)&_Var12._M_pi[1]._M_use_count = dVar23 * value2;
    _Var12._M_pi = _Var12._M_pi + 2;
    pauVar16 = pauVar16 + 2;
  }
  if (1 < (int)uVar17) {
    _Var26._vptr__Sp_counted_base = (_func_int **)(*(double *)*pauVar16 * value2);
    _Var26._8_8_ = *(double *)(*pauVar16 + 8) * value2;
    *_Var12._M_pi = _Var26;
    uVar17 = uVar17 - 2;
    pauVar16 = pauVar16 + 1;
    _Var12._M_pi = _Var12._M_pi + 1;
  }
  if (uVar17 != 0) {
    (_Var12._M_pi)->_vptr__Sp_counted_base = (_func_int **)(*(double *)*pauVar16 * value2);
  }
  uVar13 = 0;
  while (_Var12 = pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
        pauVar16 = local_50, uVar17 = length, uVar10 != uVar13) {
    ppp_Var1 = &(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                _vptr__Sp_counted_base + uVar13;
    uVar13 = uVar13 + 1;
    if (((double)*ppp_Var1 != dVar24) || (NAN((double)*ppp_Var1) || NAN(dVar24))) {
      puVar9 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar9 = "void test_arithm(unsigned int, T, T, bool) [T = double]";
      *(undefined4 *)(puVar9 + 1) = 0x5b;
      *(uint *)((long)puVar9 + 0xc) = length;
      __cxa_throw(puVar9,&Exception::typeinfo,0);
    }
  }
  for (; 3 < (int)uVar17; uVar17 = uVar17 - 4) {
    _Var21 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)divpd(*pauVar16,(undefined1  [16])_Var20)
    ;
    _Var26 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)
             divpd(pauVar16[1],(undefined1  [16])_Var20);
    *_Var12._M_pi = _Var21;
    _Var12._M_pi[1] = _Var26;
    _Var12._M_pi = _Var12._M_pi + 2;
    pauVar16 = pauVar16 + 2;
  }
  if (1 < (int)uVar17) {
    _Var21 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)divpd(*pauVar16,(undefined1  [16])_Var20)
    ;
    *_Var12._M_pi = _Var21;
    uVar17 = uVar17 - 2;
    pauVar16 = pauVar16 + 1;
    _Var12._M_pi = _Var12._M_pi + 1;
  }
  if (uVar17 != 0) {
    (_Var12._M_pi)->_vptr__Sp_counted_base = (_func_int **)(*(double *)*pauVar16 / value2);
  }
  uVar13 = 0;
  while (_Var12 = pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
        uVar17 = length, uVar10 != uVar13) {
    ppp_Var1 = &(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                _vptr__Sp_counted_base + uVar13;
    dVar22 = (double)*ppp_Var1 - dVar27;
    uVar19 = -(ulong)(dVar22 < 0.0);
    uVar13 = uVar13 + 1;
    if (2.220446049250313e-16 <=
        (double)(~uVar19 & (ulong)dVar22 | (ulong)(dVar27 - (double)*ppp_Var1) & uVar19)) {
      puVar9 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar9 = "void test_arithm(unsigned int, T, T, bool) [T = double]";
      *(undefined4 *)(puVar9 + 1) = 99;
      *(uint *)((long)puVar9 + 0xc) = length;
      __cxa_throw(puVar9,&Exception::typeinfo,0);
    }
  }
  for (; 3 < (int)uVar17; uVar17 = uVar17 - 4) {
    auVar25._8_8_ = value2;
    auVar25._0_8_ = value2;
    _Var21 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)divpd(auVar25,*local_50);
    auVar28._8_8_ = value2;
    auVar28._0_8_ = value2;
    _Var26 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)divpd(auVar28,local_50[1]);
    *_Var12._M_pi = _Var21;
    _Var12._M_pi[1] = _Var26;
    local_50 = local_50 + 2;
    _Var12._M_pi = _Var12._M_pi + 2;
  }
  if (1 < (int)uVar17) {
    _Var20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)divpd((undefined1  [16])_Var20,*local_50)
    ;
    *_Var12._M_pi = _Var20;
    uVar17 = uVar17 - 2;
    local_50 = local_50 + 1;
    _Var12._M_pi = _Var12._M_pi + 1;
  }
  if (uVar17 != 0) {
    (_Var12._M_pi)->_vptr__Sp_counted_base = (_func_int **)(value2 / *(double *)*local_50);
  }
  uVar13 = 0;
  while (uVar10 != uVar13) {
    ppp_Var1 = &(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                _vptr__Sp_counted_base + uVar13;
    dVar22 = (double)*ppp_Var1 - value2 / value1;
    uVar19 = -(ulong)(dVar22 < 0.0);
    uVar13 = uVar13 + 1;
    if (2.220446049250313e-16 <=
        (double)(~uVar19 & (ulong)dVar22 | (ulong)(value2 / value1 - (double)*ppp_Var1) & uVar19)) {
      puVar9 = (undefined8 *)__cxa_allocate_exception(0x10);
      *puVar9 = "void test_arithm(unsigned int, T, T, bool) [T = double]";
      *(undefined4 *)(puVar9 + 1) = 0x6b;
      *(uint *)((long)puVar9 + 0xc) = length;
      __cxa_throw(puVar9,&Exception::typeinfo,0);
    }
  }
  if ((!allowTrash) &&
     (((double)(&(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
                 _vptr__Sp_counted_base)[uVar10] != 127.0 ||
      (NAN((double)(&(pv2.super___shared_ptr<double,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
                     ->_vptr__Sp_counted_base)[uVar10]))))) {
    puVar9 = (undefined8 *)__cxa_allocate_exception(0x10);
    *puVar9 = "void test_arithm(unsigned int, T, T, bool) [T = double]";
    *(undefined4 *)(puVar9 + 1) = 0x70;
    *(uint *)((long)puVar9 + 0xc) = length;
    __cxa_throw(puVar9,&Exception::typeinfo,0);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&presult);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pv2);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pv1);
  return;
}

Assistant:

void test_arithm(unsigned length, T value1, T value2, bool allowTrash = false)
{
    auto pv1 = std::shared_ptr<T>(simd::malloc<T>(length), simd::free<T>);
    auto pv2 = std::shared_ptr<T>(simd::malloc<T>(length), simd::free<T>);
    auto presult = std::shared_ptr<T>(simd::malloc<T>(length+1), simd::free<T>);
    T * v1 = pv1.get();
    T * v2 = pv2.get();
    T * result = presult.get();
    result[length] = 0x7f;

    simd::set(value1, v1, length);
    simd::set(value2, v2, length);

    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(v1[i], value1) || ! equal(v2[i], value2))
            FAIL();
    }

    T r = value1 + value2;
    arithm::add(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 - value2;
    arithm::sub(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 * value2;
    arithm::mul(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 / value2;
    arithm::div(v1, v2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

#ifndef TEST_FIXED
    r = value1 + value2;
    simd::addC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 - value2;
    simd::subC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (result[i] != r)
            FAIL();
    }

    r = value2 - value1;
    simd::subCRev(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value1 * value2;
    simd::mulC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (result[i] != r)
            FAIL();
    }

    r = value1 / value2;
    simd::divC(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }

    r = value2 / value1;
    simd::divCRev(v1, value2, result, length);
    for (unsigned i = 0; i < length; ++i)
    {
        if (! equal(result[i], r))
            FAIL();
    }
#endif // TEST_FIXED

    if (!allowTrash && result[length] != 0x7f)
        FAIL();
}